

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

void variance32_avx2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int h,__m256i *vsse,
                    __m256i *vsum)

{
  int in_ESI;
  __m256i *in_RDI;
  int in_R8D;
  undefined8 *in_stack_00000008;
  int local_8c;
  __m256i *sse;
  uint8_t *ref_00;
  uint8_t *src_00;
  
  sse = (__m256i *)0x0;
  ref_00 = (uint8_t *)0x0;
  src_00 = (uint8_t *)0x0;
  *in_stack_00000008 = 0;
  in_stack_00000008[1] = 0;
  in_stack_00000008[2] = 0;
  in_stack_00000008[3] = 0;
  for (local_8c = 0; local_8c < in_R8D; local_8c = local_8c + 1) {
    variance32_kernel_avx2(src_00,ref_00,sse,in_RDI);
    in_RDI = (__m256i *)((long)*in_RDI + (long)in_ESI);
  }
  return;
}

Assistant:

static inline void variance32_avx2(const uint8_t *src, const int src_stride,
                                   const uint8_t *ref, const int ref_stride,
                                   const int h, __m256i *const vsse,
                                   __m256i *const vsum) {
  *vsum = _mm256_setzero_si256();

  for (int i = 0; i < h; i++) {
    variance32_kernel_avx2(src, ref, vsse, vsum);
    src += src_stride;
    ref += ref_stride;
  }
}